

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_namer.h
# Opt level: O2

string * __thiscall
flatbuffers::IdlNamer::LegacyRustNativeVariant_abi_cxx11_
          (string *__return_storage_ptr__,IdlNamer *this,EnumVal *v)

{
  string local_30;
  
  (*(this->super_Namer)._vptr_Namer[0xe])(&local_30);
  ConvertCase(__return_storage_ptr__,&local_30,kUpperCamel,kSnake);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string LegacyRustNativeVariant(const EnumVal &v) const {
    return ConvertCase(EscapeKeyword(v.name), Case::kUpperCamel);
  }